

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecCast(Parser *this)

{
  CompileContext *pCVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  pointer *__ptr;
  Parser *in_RSI;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Token oper;
  
  parsePrecRange(this);
  bVar3 = consume(in_RSI,AS);
  if ((!bVar3) && (bVar3 = consume(in_RSI,IS), !bVar3)) {
    return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
           (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
  }
  Token::Token(&oper,&in_RSI->m_previous);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_88 + 0x28),"Expected typename after \'",&(in_RSI->m_previous).lexeme);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 8)
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_88 + 0x28),"\'.");
  expectTypenamePrecFunction((Parser *)local_88,(string *)in_RSI,(bool)((char)local_88 + '\b'));
  std::__cxx11::string::~string((string *)(local_88 + 8));
  std::__cxx11::string::~string((string *)(local_88 + 0x28));
  std::
  make_unique<enact::CastExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,enact::Token>
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)(local_88 + 8),
             (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)this,
             (Token *)local_88);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  pCVar1 = this->m_context;
  this->m_context = (CompileContext *)_Var2._M_p;
  if ((pCVar1 != (CompileContext *)0x0) &&
     ((**(code **)((pCVar1->m_source)._M_dataplus._M_p + 8))(),
     (long *)local_80._M_dataplus._M_p != (long *)0x0)) {
    (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
  }
  if (local_88 != (undefined1  [8])0x0) {
    (**(code **)((((string *)local_88)->_M_dataplus)._M_p + 8))();
  }
  std::__cxx11::string::~string((string *)&oper.lexeme);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecCast() {
        std::unique_ptr<Expr> expr = parsePrecRange();

        if (consume(TokenType::AS) || consume(TokenType::IS)) {
            Token oper = m_previous;
            std::unique_ptr<const Typename> typename_ = expectTypename(
                    "Expected typename after '" + m_previous.lexeme + "'.");
            expr = std::make_unique<CastExpr>(std::move(expr), std::move(typename_), std::move(oper));
        }

        return expr;
    }